

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Response::set_content_provider
          (Response *this,size_t in_length,string *content_type,ContentProvider *provider,
          ContentProviderResourceReleaser *resource_releaser)

{
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Content-Type",&local_51);
  set_header(this,&local_50,content_type);
  std::__cxx11::string::~string((string *)&local_50);
  this->content_length_ = in_length;
  if (in_length != 0) {
    detail::std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::operator=
              (&this->content_provider_,provider);
  }
  detail::std::function<void_(bool)>::operator=
            (&this->content_provider_resource_releaser_,resource_releaser);
  this->is_chunked_content_provider_ = false;
  return;
}

Assistant:

inline void Response::set_content_provider(
    size_t in_length, const std::string &content_type, ContentProvider provider,
    ContentProviderResourceReleaser resource_releaser) {
  set_header("Content-Type", content_type);
  content_length_ = in_length;
  if (in_length > 0) { content_provider_ = std::move(provider); }
  content_provider_resource_releaser_ = std::move(resource_releaser);
  is_chunked_content_provider_ = false;
}